

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O3

void __thiscall
Validator_unitMissingEquivalentUnits_Test::~Validator_unitMissingEquivalentUnits_Test
          (Validator_unitMissingEquivalentUnits_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Validator, unitMissingEquivalentUnits)
{
    const std::vector<std::string> expectedIssues = {
        "Variable 'v1' in component 'c1' does not have any units specified.",
    };

    libcellml::ValidatorPtr validator = libcellml::Validator::create();
    libcellml::ModelPtr m = createModelTwoComponentsWithOneVariableEach("m", "c1", "c2", "v1", "v2");
    auto c1 = m->component(0);
    auto c2 = m->component(1);

    auto v1 = c1->variable(0);
    auto v2 = c2->variable(0);

    v2->setUnits("second");

    libcellml::Variable::addEquivalence(v1, v2);
    validator->validateModel(m);
    EXPECT_EQ_ISSUES(expectedIssues, validator);
}